

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egl_without_glx.c
# Opt level: O0

int main(void)

{
  int iVar1;
  ulong uVar2;
  long lVar3;
  undefined8 uVar4;
  uchar *string;
  EGLContext ctx;
  undefined1 local_68 [4];
  EGLint count;
  EGLint config_attribs [11];
  undefined8 local_30;
  EGLConfig cfg;
  EGLint context_attribs [3];
  EGLDisplay dpy;
  _Bool pass;
  
  context_attribs._4_8_ = get_egl_display_or_skip();
  stack0xffffffffffffffdc = 0x200003098;
  context_attribs[0] = 0x3038;
  memcpy(local_68,&DAT_00102070,0x2c);
  _epoxy_eglBindAPI = override_eglBindAPI;
  _epoxy_eglGetError = override_eglGetError;
  uVar2 = epoxy_has_egl_extension(context_attribs._4_8_,"EGL_KHR_surfaceless_context");
  if ((uVar2 & 1) == 0) {
    errx(0x4d,"Test requires EGL_KHR_surfaceless_context");
  }
  (*_epoxy_eglBindAPI)(0x30a0);
  iVar1 = (*_epoxy_eglChooseConfig)(context_attribs._4_8_,local_68,&local_30,1,(long)&ctx + 4);
  if (iVar1 == 0) {
    errx(0x4d,"Couldn\'t get an EGLConfig\n");
  }
  lVar3 = (*_epoxy_eglCreateContext)(context_attribs._4_8_,local_30,0,(long)&cfg + 4);
  if (lVar3 == 0) {
    errx(0x4d,"Couldn\'t create a GLES%d context\n",2);
  }
  (*_epoxy_eglMakeCurrent)(context_attribs._4_8_,0,0,lVar3);
  uVar4 = (*_epoxy_glGetString)(0x1f02);
  printf("GL_VERSION: %s\n",uVar4);
  iVar1 = (*_epoxy_eglGetError)();
  if (iVar1 == 0x3000) {
    return 0;
  }
  __assert_fail("eglGetError() == EGL_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/yaronct[P]libepoxy/test/egl_without_glx.c"
                ,0x87,"int main(void)");
}

Assistant:

int main(void)
{
    bool pass = true;
    EGLDisplay dpy = get_egl_display_or_skip();
    EGLint context_attribs[] = {
        EGL_CONTEXT_CLIENT_VERSION, GLES_VERSION,
        EGL_NONE
    };
    EGLConfig cfg;
    EGLint config_attribs[] = {
	EGL_SURFACE_TYPE, EGL_WINDOW_BIT,
	EGL_RED_SIZE, 1,
	EGL_GREEN_SIZE, 1,
	EGL_BLUE_SIZE, 1,
#if GLES_VERSION == 2
	EGL_RENDERABLE_TYPE, EGL_OPENGL_ES2_BIT,
#else
	EGL_RENDERABLE_TYPE, EGL_OPENGL_ES_BIT,
#endif
	EGL_NONE
    };
    EGLint count;
    EGLContext ctx;
    const unsigned char *string;

    epoxy_eglBindAPI = override_eglBindAPI;
    epoxy_eglGetError = override_eglGetError;

    if (!epoxy_has_egl_extension(dpy, "EGL_KHR_surfaceless_context"))
        errx(77, "Test requires EGL_KHR_surfaceless_context");

    eglBindAPI(EGL_OPENGL_ES_API);

    if (!eglChooseConfig(dpy, config_attribs, &cfg, 1, &count))
        errx(77, "Couldn't get an EGLConfig\n");

    ctx = eglCreateContext(dpy, cfg, NULL, context_attribs);
    if (!ctx)
        errx(77, "Couldn't create a GLES%d context\n", GLES_VERSION);

    eglMakeCurrent(dpy, NULL, NULL, ctx);

    string = glGetString(GL_VERSION);
    printf("GL_VERSION: %s\n", string);

    assert(eglGetError() == EGL_SUCCESS);

    return pass != true;
}